

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderHelperInvocationTests::init
          (ShaderHelperInvocationTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  PrimitiveType primType;
  Context *pCVar4;
  TestNode *pTVar5;
  long *plVar6;
  long lVar7;
  HelperInvocationDerivateCase *pHVar8;
  long *plVar9;
  anon_struct_16_2_b755e78b *paVar10;
  long lVar11;
  string name;
  uint in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff60;
  allocator<char> local_91;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  TestNode *local_50;
  TestNode *local_48;
  anon_struct_16_2_b755e78b *local_40;
  long local_38;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"value",
             "gl_HelperInvocation value in rendered pixels");
  local_50 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar7 = 0;
  local_48 = (TestNode *)this;
  do {
    lVar11 = 8;
    local_40 = (anon_struct_16_2_b755e78b *)lVar7;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,*(char **)(&UNK_02170ce8 + lVar11),&local_91);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      local_70 = &local_60;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar6[3];
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      uVar1 = *(undefined4 *)((long)&init::s_primTypes[0].caseName + lVar11);
      iVar2 = init::s_sampleCounts[lVar7].numSamples;
      pTVar5 = (TestNode *)operator_new(0xb0);
      pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,(char *)local_70,
                 ::glcts::fixed_sample_locations_values + 1);
      pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__HelperInvocationValueCase_02170da8;
      *(undefined4 *)&pTVar5[1].m_testCtx = uVar1;
      *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar2;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xa00000005;
      pTVar5[1].m_name._M_string_length = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar5[1].m_description._M_string_length = 0;
      tcu::TestNode::addChild(local_50,pTVar5);
      this = (ShaderHelperInvocationTests *)local_48;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x58);
    lVar7 = (long)local_40 + 1;
  } while (lVar7 != 4);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"derivate",
             "Derivate of gl_HelperInvocation-dependent value");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  local_38 = 0;
  local_50 = pTVar5;
  do {
    paVar10 = init::s_sampleCounts + local_38;
    lVar7 = 8;
    local_40 = paVar10;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,*(char **)(&UNK_02170ce8 + lVar7),&local_91);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      local_70 = &local_60;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar6[3];
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      uVar3 = *(uint *)((long)&init::s_primTypes[0].caseName + lVar7);
      primType = paVar10->numSamples;
      pHVar8 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_70,(long)local_70 + local_68);
      std::__cxx11::string::append((char *)local_90);
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar8,pCVar4,(char *)local_90[0],(char *)(ulong)uVar3,primType,0x1bf354c,
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,1),(bool)in_stack_ffffffffffffff60);
      tcu::TestNode::addChild(local_50,(TestNode *)pHVar8);
      pTVar5 = local_48;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      pHVar8 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar4 = (Context *)pTVar5[1]._vptr_TestNode;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_70,(long)local_70 + local_68);
      std::__cxx11::string::append((char *)local_90);
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar8,pCVar4,(char *)local_90[0],(char *)(ulong)uVar3,primType,0x1bf3564,
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,1),(bool)in_stack_ffffffffffffff60);
      tcu::TestNode::addChild(local_50,(TestNode *)pHVar8);
      pTVar5 = local_48;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      pHVar8 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar4 = (Context *)pTVar5[1]._vptr_TestNode;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_70,(long)local_70 + local_68);
      std::__cxx11::string::append((char *)local_90);
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar8,pCVar4,(char *)local_90[0],(char *)(ulong)uVar3,primType,0x1c8a758,
                 (char *)((ulong)in_stack_ffffffffffffff5c << 0x20),(bool)in_stack_ffffffffffffff60)
      ;
      tcu::TestNode::addChild(local_50,(TestNode *)pHVar8);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      paVar10 = local_40;
      this = (ShaderHelperInvocationTests *)local_48;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x58);
    local_38 = local_38 + 1;
  } while (local_38 != 4);
  return 4;
}

Assistant:

void ShaderHelperInvocationTests::init (void)
{
	static const struct
	{
		const char*		caseName;
		PrimitiveType	primType;
	} s_primTypes[] =
	{
		{ "triangles",		PRIMITIVETYPE_TRIANGLE		},
		{ "lines",			PRIMITIVETYPE_LINE			},
		{ "wide_lines",		PRIMITIVETYPE_WIDE_LINE		},
		{ "points",			PRIMITIVETYPE_POINT			},
		{ "wide_points",	PRIMITIVETYPE_WIDE_POINT	}
	};

	static const struct
	{
		const char*		suffix;
		int				numSamples;
	} s_sampleCounts[] =
	{
		{ "",					0				},
		{ "_4_samples",			4				},
		{ "_8_samples",			8				},
		{ "_max_samples",		NUM_SAMPLES_MAX	}
	};

	// value
	{
		tcu::TestCaseGroup* const valueGroup = new tcu::TestCaseGroup(m_testCtx, "value", "gl_HelperInvocation value in rendered pixels");
		addChild(valueGroup);

		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(s_sampleCounts); sampleCountNdx++)
		{
			for (int primTypeNdx = 0; primTypeNdx < DE_LENGTH_OF_ARRAY(s_primTypes); primTypeNdx++)
			{
				const string		name		= string(s_primTypes[primTypeNdx].caseName) + s_sampleCounts[sampleCountNdx].suffix;
				const PrimitiveType	primType	= s_primTypes[primTypeNdx].primType;
				const int			numSamples	= s_sampleCounts[sampleCountNdx].numSamples;

				valueGroup->addChild(new HelperInvocationValueCase(m_context, name.c_str(), "", primType, numSamples));
			}
		}
	}

	// derivate
	{
		tcu::TestCaseGroup* const derivateGroup = new tcu::TestCaseGroup(m_testCtx, "derivate", "Derivate of gl_HelperInvocation-dependent value");
		addChild(derivateGroup);

		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(s_sampleCounts); sampleCountNdx++)
		{
			for (int primTypeNdx = 0; primTypeNdx < DE_LENGTH_OF_ARRAY(s_primTypes); primTypeNdx++)
			{
				const string		name		= string(s_primTypes[primTypeNdx].caseName) + s_sampleCounts[sampleCountNdx].suffix;
				const PrimitiveType	primType	= s_primTypes[primTypeNdx].primType;
				const int			numSamples	= s_sampleCounts[sampleCountNdx].numSamples;

				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_dfdx").c_str(),	"", primType, numSamples, "dFdx",	true));
				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_dfdy").c_str(),	"", primType, numSamples, "dFdy",	true));
				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_fwidth").c_str(),	"", primType, numSamples, "fwidth",	false));
			}
		}
	}
}